

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_2_5::Vec3<short>>(char *type)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  short *psVar4;
  char *in_RDI;
  Box<Imath_2_5::Vec3<short>_> b_1;
  Vec3<short> max;
  Vec3<short> min;
  Box<Imath_2_5::Vec3<short>_> b1;
  uint i;
  Vec3<short> p1;
  Vec3<short> p0;
  Box<Imath_2_5::Vec3<short>_> b0;
  Box<Imath_2_5::Vec3<short>_> b;
  Box<Imath_2_5::Vec3<short>_> *in_stack_ffffffffffffffa0;
  Vec3<short> *in_stack_ffffffffffffffa8;
  Box<Imath_2_5::Vec3<short>_> *in_stack_ffffffffffffffb0;
  Box<Imath_2_5::Vec3<short>_> *in_stack_ffffffffffffffb8;
  uint local_3c;
  Vec3<short> local_38;
  Vec3<short> local_32;
  Vec3<short> local_2c;
  Vec3<short> local_26 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box(in_stack_ffffffffffffffa0);
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::makeInfinite(in_stack_ffffffffffffffb0);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::isInfinite(in_stack_ffffffffffffffb8);
  if (!bVar1) {
    __assert_fail("b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,799,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Vec3<short>::Vec3(local_26,-1);
  Imath_2_5::Vec3<short>::Vec3(&local_2c,1);
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->min);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::isInfinite(in_stack_ffffffffffffffb8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x32a,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Vec3<short>::Vec3(&local_32);
  Imath_2_5::Vec3<short>::Vec3(&local_38);
  local_3c = 0;
  while( true ) {
    uVar2 = Imath_2_5::Vec3<short>::dimensions();
    if (uVar2 <= local_3c) break;
    psVar4 = Imath_2_5::Vec3<short>::operator[](&local_32,local_3c);
    *psVar4 = -(short)(1 << ((char)local_3c + 1U & 0x1f));
    uVar2 = Imath_2_5::Vec3<short>::dimensions();
    psVar4 = Imath_2_5::Vec3<short>::operator[](&local_38,local_3c);
    *psVar4 = (short)(1 << ((char)uVar2 - (char)local_3c & 0x1fU));
    local_3c = local_3c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->min);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::isInfinite(in_stack_ffffffffffffffb8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x334,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  Imath_2_5::Vec3<short>::Vec3((Vec3<short> *)&stack0xffffffffffffffb2,0);
  Imath_2_5::Vec3<short>::Vec3
            ((Vec3<short> *)&stack0xffffffffffffffac,(Vec3<short> *)&stack0xffffffffffffffb2);
  uVar2 = Imath_2_5::Vec3<short>::dimensions();
  psVar4 = Imath_2_5::Vec3<short>::operator[]((Vec3<short> *)&stack0xffffffffffffffac,uVar2 - 1);
  *psVar4 = 2;
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->min);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::isInfinite(in_stack_ffffffffffffffb8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x345,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite(const char *type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.isInfinite());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isInfinite());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isInfinite());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isInfinite());
    }
}